

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::hash_pnext_chain
               (StateRecorder *recorder,Hasher *h,void *pNext,DynamicStateInfo *dynamic_state_info,
               VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkStructureType sType;
  VkStructureType value;
  VkStructureType VVar1;
  bool bVar2;
  allocator local_61;
  string local_60;
  DynamicStateInfo *local_40;
  VkBaseInStructure *pin;
  DynamicStateInfo *pDStack_30;
  VkGraphicsPipelineLibraryFlagsEXT state_flags_local;
  DynamicStateInfo *dynamic_state_info_local;
  void *pNext_local;
  Hasher *h_local;
  StateRecorder *recorder_local;
  
  pin._4_4_ = state_flags;
  pDStack_30 = dynamic_state_info;
  dynamic_state_info_local = (DynamicStateInfo *)pNext;
  pNext_local = h;
  h_local = (Hasher *)recorder;
  do {
    while( true ) {
      local_40 = (DynamicStateInfo *)pnext_chain_skip_ignored_entries(dynamic_state_info_local);
      if (local_40 == (DynamicStateInfo *)0x0) {
        return true;
      }
      sType._0_1_ = local_40->stencil_compare;
      sType._1_1_ = local_40->stencil_reference;
      sType._2_1_ = local_40->stencil_write_mask;
      sType._3_1_ = local_40->depth_bounds;
      dynamic_state_info_local = local_40;
      bVar2 = pnext_chain_stype_is_hash_invariant(sType);
      if (!bVar2) break;
      dynamic_state_info_local = *(DynamicStateInfo **)&local_40->viewport;
    }
    value._0_1_ = local_40->stencil_compare;
    value._1_1_ = local_40->stencil_reference;
    value._2_1_ = local_40->stencil_write_mask;
    value._3_1_ = local_40->depth_bounds;
    Hasher::s32((Hasher *)pNext_local,value);
    VVar1._0_1_ = local_40->stencil_compare;
    VVar1._1_1_ = local_40->stencil_reference;
    VVar1._2_1_ = local_40->stencil_write_mask;
    VVar1._3_1_ = local_40->depth_bounds;
    if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineRasterizationStateStreamCreateInfoEXT *)dynamic_state_info_local,
                        pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineRenderingCreateInfoKHR *)dynamic_state_info_local,pin._4_4_);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkRenderPassMultiviewCreateInfo *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineRobustnessCreateInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineDiscardRectangleStateCreateInfoEXT *)dynamic_state_info_local,
                        pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineRasterizationConservativeStateCreateInfoEXT *)
                        dynamic_state_info_local,pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineRasterizationDepthClipStateCreateInfoEXT *)
                        dynamic_state_info_local,pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkRenderPassInputAttachmentAspectCreateInfo *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineTessellationDomainOriginStateCreateInfo *)
                        dynamic_state_info_local,pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkSamplerReductionModeCreateInfo *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkSampleLocationsInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT) {
      bVar2 = hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                                (VkPipelineSampleLocationsStateCreateInfoEXT *)
                                dynamic_state_info_local,pDStack_30);
      if (!bVar2) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineColorBlendAdvancedStateCreateInfoEXT *)dynamic_state_info_local,
                        pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkSamplerYcbcrConversionCreateInfo *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineVertexInputDivisorStateCreateInfoKHR *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE) {
      bVar2 = hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                                (VkSubpassDescriptionDepthStencilResolve *)dynamic_state_info_local)
      ;
      if (!bVar2) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkRenderPassFragmentDensityMapCreateInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *)
                        dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR) {
      bVar2 = hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                                (VkFragmentShadingRateAttachmentInfoKHR *)dynamic_state_info_local);
      if (!bVar2) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineFragmentShadingRateStateCreateInfoKHR *)dynamic_state_info_local,
                        pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkRenderingAttachmentLocationInfoKHR *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkRenderingInputAttachmentIndexInfoKHR *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkAttachmentReferenceStencilLayoutKHR *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkAttachmentDescriptionStencilLayoutKHR *)dynamic_state_info_local);
    }
    else if (VVar1 == 
             VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *)
                        dynamic_state_info_local,pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineRasterizationLineStateCreateInfoKHR *)dynamic_state_info_local,
                        pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkDepthBiasRepresentationInfoEXT *)dynamic_state_info_local,pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkSamplerCustomBorderColorCreateInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR) {
      bVar2 = hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                                (VkPipelineLibraryCreateInfoKHR *)dynamic_state_info_local);
      if (!bVar2) {
        return false;
      }
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MEMORY_BARRIER_2) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkMemoryBarrier2KHR *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkGraphicsPipelineLibraryCreateInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkMutableDescriptorTypeCreateInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineViewportDepthClipControlCreateInfoEXT *)dynamic_state_info_local,
                        pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkMultisampledRenderToSingleSampledInfoEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineColorWriteCreateInfoEXT *)dynamic_state_info_local,pDStack_30);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkSamplerBorderColorComponentMappingCreateInfoEXT *)
                        dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkRenderPassCreationControlEXT *)dynamic_state_info_local);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineCreateFlags2CreateInfoKHR *)dynamic_state_info_local);
    }
    else {
      if (VVar1 != VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_60,"Unsupported pNext found, cannot hash.",&local_61);
        log_error_pnext_chain(&local_60,dynamic_state_info_local);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        return false;
      }
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPipelineViewportDepthClampControlCreateInfoEXT *)dynamic_state_info_local
                        ,pDStack_30);
    }
    dynamic_state_info_local = *(DynamicStateInfo **)&local_40->viewport;
  } while( true );
}

Assistant:

static bool hash_pnext_chain(const StateRecorder *recorder, Hasher &h, const void *pNext,
                             const DynamicStateInfo *dynamic_state_info,
                             VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	while ((pNext = pnext_chain_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);

		if (pnext_chain_stype_is_hash_invariant(pin->sType))
		{
			pNext = pin->pNext;
			continue;
		}

		h.s32(pin->sType);

		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineTessellationDomainOriginStateCreateInfo *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineVertexInputDivisorStateCreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationStateStreamCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorBlendAdvancedStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationConservativeStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentDescriptionStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkAttachmentReferenceStencilLayoutKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext), state_flags);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineColorWriteCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext), dynamic_state_info))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerReductionModeCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineDiscardRectangleStateCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkMemoryBarrier2KHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineFragmentShadingRateStateCreateInfoKHR *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerYcbcrConversionCreateInfo *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkGraphicsPipelineLibraryCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
			if (!hash_pnext_struct(recorder, h, *static_cast<const VkPipelineLibraryCreateInfoKHR *>(pNext)))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClipControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineCreateFlags2CreateInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassCreationControlEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSamplerBorderColorComponentMappingCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkMultisampledRenderToSingleSampledInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderPassFragmentDensityMapCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkSampleLocationsInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPipelineViewportDepthClampControlCreateInfoEXT *>(pNext), dynamic_state_info);
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingAttachmentLocationInfoKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkRenderingInputAttachmentIndexInfoKHR *>(pNext));
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash.", pNext);
			return false;
		}

		pNext = pin->pNext;
	}

	return true;
}